

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

bool __thiscall
soplex::SPxBoundFlippingRT<double>::getData
          (SPxBoundFlippingRT<double> *this,double *val,int *leaveIdx,int idx,double stab,
          double degeneps,double *upd,double *vec,double *low,double *upp,BreakpointSource src,
          double max)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  Status SVar3;
  pointer pdVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = upd[idx];
  if (stab <= ABS(dVar1)) {
    pdVar5 = low;
    if (0.0 < dVar1 * max) {
      pdVar5 = upp;
    }
    *leaveIdx = idx;
    dVar8 = pdVar5[idx];
    *val = dVar8;
    dVar8 = (dVar8 - vec[idx]) / dVar1;
    *val = dVar8;
    if ((upp[idx] != low[idx]) || (NAN(upp[idx]) || NAN(low[idx]))) {
      if (((0.0 < max) && (dVar8 < -degeneps)) || ((max < 0.0 && (degeneps < dVar8)))) {
        *val = 0.0;
        pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
        SVar3 = SPxBasisBase<double>::dualStatus
                          (&pSVar2->super_SPxBasisBase<double>,
                           (pSVar2->super_SPxBasisBase<double>).theBaseId.data + idx);
        if (SVar3 != D_ON_BOTH) {
          pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
          dVar8 = vec[idx];
          if (dVar1 * max <= 0.0) {
            pdVar4 = (pSVar2->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar7 = (double)-(ulong)(dVar8 < pdVar4[idx]);
            dVar6 = pdVar4[idx] - dVar8;
          }
          else {
            pdVar4 = (pSVar2->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar7 = dVar8 - pdVar4[idx];
            dVar6 = (double)-(ulong)(pdVar4[idx] < dVar8);
          }
          pSVar2->theShift = pSVar2->theShift + (double)((ulong)dVar6 & (ulong)dVar7);
          pdVar4[idx] = dVar8;
        }
      }
    }
    else {
      *val = 0.0;
      pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
      dVar8 = vec[idx];
      pdVar4 = (pSVar2->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar6 = pdVar4[idx];
      pSVar2->theShift =
           (double)((ulong)(dVar6 - dVar8) & -(ulong)(dVar8 < dVar6)) + pSVar2->theShift;
      pdVar4[idx] = dVar8;
      dVar8 = vec[idx];
      pdVar4 = (pSVar2->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar6 = pdVar4[idx];
      pSVar2->theShift =
           (double)(-(ulong)(dVar6 < dVar8) & (ulong)(dVar8 - dVar6)) + pSVar2->theShift;
      pdVar4[idx] = dVar8;
    }
  }
  return stab <= ABS(dVar1);
}

Assistant:

bool SPxBoundFlippingRT<R>::getData(
   R&                 val,
   int&                  leaveIdx,
   int                   idx,
   R                  stab,
   R                  degeneps,
   const R*           upd,
   const R*           vec,
   const R*           low,
   const R*           upp,
   BreakpointSource      src,
   R                  max
)
{
   assert(src == FVEC);

   R x = upd[idx];

   // skip breakpoint if it is too small
   if(spxAbs(x) < stab)
   {
      return false;
   }

   leaveIdx = idx;
   val = (max * x > 0) ? upp[idx] : low[idx];
   val = (val - vec[idx]) / x;

   if(upp[idx] == low[idx])
   {
      val = 0.0;
      this->thesolver->shiftLBbound(idx, vec[idx]);
      this->thesolver->shiftUBbound(idx, vec[idx]);
   }
   else if((max > 0 && val < -degeneps) || (max < 0 && val > degeneps))
   {
      val = 0.0;

      if(this->thesolver->dualStatus(this->thesolver->baseId(idx)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(max * x > 0)
            this->thesolver->shiftUBbound(idx, vec[idx]);
         else
            this->thesolver->shiftLBbound(idx, vec[idx]);
      }
   }

   return true;
}